

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

MeasuredBRDF * pbrt::MeasuredBRDF::Create(string *filename,Allocator alloc)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  float *pfVar9;
  size_type n;
  uchar *puVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  array<int,_3> aVar18;
  array<const_float_*,_2> aVar19;
  array<const_float_*,_2> aVar20;
  array<const_float_*,_3> aVar21;
  Allocator AVar22;
  Field *pFVar23;
  Field *pFVar24;
  Field *pFVar25;
  Field *pFVar26;
  Field *pFVar27;
  Field *pFVar28;
  Field *pFVar29;
  Field *pFVar30;
  Field *pFVar31;
  Field *pFVar32;
  MeasuredBRDF *this;
  size_t sVar33;
  size_t sVar34;
  size_t sVar35;
  size_t i;
  size_type sVar36;
  long in_FS_OFFSET;
  undefined1 auVar37 [16];
  initializer_list<int> v;
  initializer_list<const_float_*> v_00;
  initializer_list<int> v_01;
  initializer_list<const_float_*> v_02;
  initializer_list<int> v_03;
  initializer_list<const_float_*> v_04;
  Allocator alloc_local;
  _Head_base<0UL,_unsigned_char_*,_false> local_1c8;
  uchar *local_1c0;
  uchar *local_1b8;
  PiecewiseLinear2D<2UL> *local_1b0;
  int reduction;
  int local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  Tensor tf;
  array<int,_2> local_88;
  array<int,_2> local_80;
  array<int,_3> local_78;
  array<const_float_*,_2> local_68;
  array<const_float_*,_2> local_58;
  array<const_float_*,_3> local_48;
  
  alloc_local = alloc;
  Tensor::Tensor(&tf,filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"theta_i",(allocator<char> *)&local_1c8);
  pFVar23 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"phi_i",(allocator<char> *)&local_1c8);
  pFVar24 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"ndf",(allocator<char> *)&local_1c8);
  pFVar25 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"sigma",(allocator<char> *)&local_1c8);
  pFVar26 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"vndf",(allocator<char> *)&local_1c8);
  pFVar27 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"spectra",(allocator<char> *)&local_1c8);
  pFVar28 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"luminance",(allocator<char> *)&local_1c8);
  pFVar29 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"wavelengths",(allocator<char> *)&local_1c8);
  pFVar30 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"description",(allocator<char> *)&local_1c8);
  pFVar31 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reduction,"jacobian",(allocator<char> *)&local_1c8);
  pFVar32 = Tensor::field(&tf,(string *)&reduction);
  std::__cxx11::string::~string((string *)&reduction);
  if (((((((((long)(pFVar31->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pFVar31->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 8) && (pFVar31->dtype == UInt8)) &&
          (puVar1 = (pFVar23->shape).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (long)(pFVar23->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 8)) &&
         (((pFVar23->dtype == Float32 &&
           (puVar2 = (pFVar24->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
           (long)(pFVar24->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 == 8)) &&
          ((pFVar24->dtype == Float32 &&
           ((puVar3 = (pFVar30->shape).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (long)(pFVar30->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 == 8 &&
            (pFVar30->dtype == Float32)))))))) &&
        ((long)(pFVar25->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(pFVar25->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x10)) &&
       ((((((pFVar25->dtype == Float32 &&
            ((long)(pFVar26->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pFVar26->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 0x10)) && (pFVar26->dtype == Float32)) &&
          ((puVar4 = (pFVar27->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
           (long)(pFVar27->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 == 0x20 &&
           (pFVar27->dtype == Float32)))) && (uVar5 = *puVar4, uVar5 == *puVar2)) &&
        (((uVar6 = puVar4[1], uVar6 == *puVar1 &&
          (puVar4 = (pFVar29->shape).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (long)(pFVar29->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 == 0x20)) &&
         (((pFVar29->dtype == Float32 &&
           (((*puVar4 == uVar5 && (puVar4[1] == uVar6)) && (uVar7 = puVar4[2], uVar7 == puVar4[3])))
           ) && (((pFVar28->dtype == Float32 &&
                  (puVar4 = (pFVar28->shape).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                  (long)(pFVar28->shape).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4 == 0x28)) &&
                 (*puVar4 == uVar5)))))))))) &&
      (((puVar4[1] == uVar6 && (puVar4[2] == *puVar3)) &&
       ((uVar7 == puVar4[4] &&
        (((uVar7 == puVar4[3] && (puVar4[3] == puVar4[4])) &&
         (puVar1 = (pFVar32->shape).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,
         (long)(pFVar32->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 8)))))))) &&
     ((*puVar1 == 1 && (pFVar32->dtype == UInt8)))) {
    this = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MeasuredBRDF,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&alloc_local);
    std::__cxx11::string::_M_assign((string *)&this->filename);
    uVar8 = *(pFVar24->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->isotropic = uVar8 < 3;
    this->jacobian =
         *(pFVar32->data)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != '\0';
    if (2 < uVar8) {
      pfVar9 = (float *)(pFVar24->data)._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      auVar37 = ZEXT416((uint)(6.2831855 / ((pfVar9 + 0xffffffffffffffff)[uVar8] - *pfVar9)));
      auVar37 = vroundss_avx(auVar37,auVar37,4);
      reduction = (int)auVar37._0_4_;
      if (reduction != 1) {
        ErrorExit<std::__cxx11::string_const&,int&>
                  ("%s: reduction %d (!= 1) not supported",filename,&reduction);
      }
    }
    puVar1 = (pFVar25->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    PiecewiseLinear2D<0UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<0UL> *)&reduction,alloc_local.memoryResource,
               (pFVar25->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar1[1],
               (int)*puVar1,0,0);
    PiecewiseLinear2D<0UL>::operator=(&this->ndf,(PiecewiseLinear2D<0UL> *)&reduction);
    PiecewiseLinear2D<0UL>::~PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)&reduction);
    puVar1 = (pFVar26->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    PiecewiseLinear2D<0UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<0UL> *)&reduction,alloc_local.memoryResource,
               (pFVar26->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,(int)puVar1[1],
               (int)*puVar1,0,0);
    PiecewiseLinear2D<0UL>::operator=(&this->sigma,(PiecewiseLinear2D<0UL> *)&reduction);
    PiecewiseLinear2D<0UL>::~PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)&reduction);
    AVar22 = alloc_local;
    puVar1 = (pFVar27->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pfVar9 = (float *)(pFVar27->data)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    uVar5 = puVar1[2];
    local_1b0 = (PiecewiseLinear2D<2UL> *)CONCAT44(local_1b0._4_4_,(int)puVar1[3]);
    local_f4 = (int)*(pFVar24->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_f0 = (undefined4)
               *(pFVar23->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
    v._M_len = 2;
    v._M_array = &local_f4;
    pstd::array<int,_2>::array(&local_80,v);
    local_1c8._M_head_impl =
         (pFVar24->data)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_1c0 = (pFVar23->data)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    v_00._M_len = 2;
    v_00._M_array = (iterator)&local_1c8;
    pstd::array<const_float_*,_2>::array(&local_58,v_00);
    aVar19.values[1]._0_4_ = (int)local_58.values[1];
    aVar19.values[0] = local_58.values[0];
    aVar19.values[1]._4_4_ = (int)((ulong)local_58.values[1] >> 0x20);
    PiecewiseLinear2D<2UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<2UL> *)&reduction,AVar22,pfVar9,(int)local_1b0,(int)uVar5,local_80
               ,aVar19,true,true);
    local_1b0 = &this->vndf;
    PiecewiseLinear2D<2UL>::operator=(local_1b0,(PiecewiseLinear2D<2UL> *)&reduction);
    PiecewiseLinear2D<2UL>::~PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)&reduction);
    AVar22 = alloc_local;
    puVar1 = (pFVar29->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pfVar9 = (float *)(pFVar29->data)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    local_f4 = (int)*(pFVar24->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_f0 = (undefined4)
               *(pFVar23->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
    v_01._M_len = 2;
    v_01._M_array = &local_f4;
    pstd::array<int,_2>::array(&local_88,v_01);
    local_1c8._M_head_impl =
         (pFVar24->data)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_1c0 = (pFVar23->data)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    v_02._M_len = 2;
    v_02._M_array = (iterator)&local_1c8;
    pstd::array<const_float_*,_2>::array(&local_68,v_02);
    aVar20.values[1]._0_4_ = (int)local_68.values[1];
    aVar20.values[0] = local_68.values[0];
    aVar20.values[1]._4_4_ = (int)((ulong)local_68.values[1] >> 0x20);
    PiecewiseLinear2D<2UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<2UL> *)&reduction,AVar22,pfVar9,(int)uVar6,(int)uVar5,local_88,
               aVar20,true,true);
    PiecewiseLinear2D<2UL>::operator=(&this->luminance,(PiecewiseLinear2D<2UL> *)&reduction);
    PiecewiseLinear2D<2UL>::~PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)&reduction);
    n = *(pFVar30->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize(&this->wavelengths,n);
    AVar22 = alloc_local;
    puVar10 = (pFVar30->data)._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    for (sVar36 = 0; n != sVar36; sVar36 = sVar36 + 1) {
      (this->wavelengths).ptr[sVar36] = *(float *)(puVar10 + sVar36 * 4);
    }
    puVar1 = (pFVar28->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pfVar9 = (float *)(pFVar28->data)._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    uVar5 = puVar1[3];
    uVar6 = puVar1[4];
    local_f4 = (int)*(pFVar24->shape).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_f0 = (undefined4)
               *(pFVar23->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_ec = (undefined4)
               *(pFVar30->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
    v_03._M_len = 3;
    v_03._M_array = &local_f4;
    pstd::array<int,_3>::array(&local_78,v_03);
    local_1c8._M_head_impl =
         (pFVar24->data)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_1c0 = (pFVar23->data)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_1b8 = (pFVar30->data)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    v_04._M_len = 3;
    v_04._M_array = (iterator)&local_1c8;
    pstd::array<const_float_*,_3>::array(&local_48,v_04);
    aVar18.values[2] = local_78.values[2];
    aVar18.values[0] = local_78.values[0];
    aVar18.values[1] = local_78.values[1];
    aVar21.values[1]._0_4_ = (int)local_48.values[1];
    aVar21.values[0] = local_48.values[0];
    aVar21.values[1]._4_4_ = (int)((ulong)local_48.values[1] >> 0x20);
    aVar21.values[2] = local_48.values[2];
    PiecewiseLinear2D<3UL>::PiecewiseLinear2D
              ((PiecewiseLinear2D<3UL> *)&reduction,AVar22,pfVar9,(int)uVar6,(int)uVar5,aVar18,
               aVar21,false,false);
    PiecewiseLinear2D<3UL>::operator=(&this->spectra,(PiecewiseLinear2D<3UL> *)&reduction);
    PiecewiseLinear2D<3UL>::~PiecewiseLinear2D((PiecewiseLinear2D<3UL> *)&reduction);
    sVar11 = (this->ndf).m_data.nAlloc;
    sVar12 = (this->wavelengths).nStored;
    sVar13 = (this->ndf).m_marginal_cdf.nAlloc;
    sVar14 = (this->ndf).m_conditional_cdf.nAlloc;
    sVar15 = (this->sigma).m_data.nAlloc;
    sVar16 = (this->sigma).m_marginal_cdf.nAlloc;
    sVar17 = (this->sigma).m_conditional_cdf.nAlloc;
    sVar33 = PiecewiseLinear2D<2UL>::BytesUsed(local_1b0);
    sVar34 = PiecewiseLinear2D<2UL>::BytesUsed(&this->luminance);
    sVar35 = PiecewiseLinear2D<3UL>::BytesUsed(&this->spectra);
    *(size_t *)(in_FS_OFFSET + -0x58) =
         *(long *)(in_FS_OFFSET + -0x58) + 0x378 +
         sVar35 + sVar34 +
         sVar33 + (sVar11 + sVar12 + sVar13 + sVar14 + sVar15 + sVar16 + sVar17) * 4;
  }
  else {
    Error<std::__cxx11::string_const&,pbrt::Tensor&>
              ("%s: invalid BRDF file structure: %s",filename,&tf);
    this = (MeasuredBRDF *)0x0;
  }
  Tensor::~Tensor(&tf);
  return this;
}

Assistant:

MeasuredBRDF *MeasuredBRDF::Create(const std::string &filename, Allocator alloc) {
    Tensor tf = Tensor(filename);
    auto &theta_i = tf.field("theta_i");
    auto &phi_i = tf.field("phi_i");
    auto &ndf = tf.field("ndf");
    auto &sigma = tf.field("sigma");
    auto &vndf = tf.field("vndf");
    auto &spectra = tf.field("spectra");
    auto &luminance = tf.field("luminance");
    auto &wavelengths = tf.field("wavelengths");
    auto &description = tf.field("description");
    auto &jacobian = tf.field("jacobian");

    if (!(description.shape.size() == 1 && description.dtype == Tensor::UInt8 &&

          theta_i.shape.size() == 1 && theta_i.dtype == Tensor::Float32 &&

          phi_i.shape.size() == 1 && phi_i.dtype == Tensor::Float32 &&

          wavelengths.shape.size() == 1 && wavelengths.dtype == Tensor::Float32 &&

          ndf.shape.size() == 2 && ndf.dtype == Tensor::Float32 &&

          sigma.shape.size() == 2 && sigma.dtype == Tensor::Float32 &&

          vndf.shape.size() == 4 && vndf.dtype == Tensor::Float32 &&
          vndf.shape[0] == phi_i.shape[0] && vndf.shape[1] == theta_i.shape[0] &&

          luminance.shape.size() == 4 && luminance.dtype == Tensor::Float32 &&
          luminance.shape[0] == phi_i.shape[0] &&
          luminance.shape[1] == theta_i.shape[0] &&
          luminance.shape[2] == luminance.shape[3] &&

          spectra.dtype == Tensor::Float32 && spectra.shape.size() == 5 &&
          spectra.shape[0] == phi_i.shape[0] && spectra.shape[1] == theta_i.shape[0] &&
          spectra.shape[2] == wavelengths.shape[0] &&
          spectra.shape[3] == spectra.shape[4] &&

          luminance.shape[2] == spectra.shape[3] &&
          luminance.shape[3] == spectra.shape[4] &&

          jacobian.shape.size() == 1 && jacobian.shape[0] == 1 &&
          jacobian.dtype == Tensor::UInt8)) {
        Error("%s: invalid BRDF file structure: %s", filename, tf);
        return nullptr;
    }

    MeasuredBRDF *brdf = alloc.new_object<MeasuredBRDF>(alloc);
    brdf->filename = filename;
    brdf->isotropic = phi_i.shape[0] <= 2;
    brdf->jacobian = ((uint8_t *)jacobian.data.get())[0];

    if (!brdf->isotropic) {
        float *phi_i_data = (float *)phi_i.data.get();
        int reduction =
            (int)std::rint((2 * Pi) / (phi_i_data[phi_i.shape[0] - 1] - phi_i_data[0]));
        if (reduction != 1)
            ErrorExit("%s: reduction %d (!= 1) not supported", filename, reduction);
    }

    /* Construct NDF interpolant data structure */
    brdf->ndf = Warp2D0(alloc, (float *)ndf.data.get(), ndf.shape[1], ndf.shape[0], {},
                        {}, false, false);

    /* Construct projected surface area interpolant data structure */
    brdf->sigma = Warp2D0(alloc, (float *)sigma.data.get(), sigma.shape[1],
                          sigma.shape[0], {}, {}, false, false);

    /* Construct VNDF warp data structure */
    brdf->vndf =
        Warp2D2(alloc, (float *)vndf.data.get(), vndf.shape[3], vndf.shape[2],
                {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Construct Luminance warp data structure */
    brdf->luminance =
        Warp2D2(alloc, (float *)luminance.data.get(), luminance.shape[3],
                luminance.shape[2], {{(int)phi_i.shape[0], (int)theta_i.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get()}});

    /* Copy wavelength information */
    size_t size = wavelengths.shape[0];
    brdf->wavelengths.resize(size);
    for (size_t i = 0; i < size; ++i)
        brdf->wavelengths[i] = ((const float *)wavelengths.data.get())[i];

    /* Construct spectral interpolant */
    brdf->spectra =
        Warp2D3(alloc, (float *)spectra.data.get(), spectra.shape[4], spectra.shape[3],
                {{(int)phi_i.shape[0], (int)theta_i.shape[0], (int)wavelengths.shape[0]}},
                {{(const float *)phi_i.data.get(), (const float *)theta_i.data.get(),
                  (const float *)wavelengths.data.get()}},
                false, false);

    measuredBRDFBytes += sizeof(MeasuredBRDF) + 4 * brdf->wavelengths.size() +
                         brdf->ndf.BytesUsed() + brdf->sigma.BytesUsed() +
                         brdf->vndf.BytesUsed() + brdf->luminance.BytesUsed() +
                         brdf->spectra.BytesUsed();

    return brdf;
}